

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBCD
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,int8_t *sign,
          int32_t *exponent,ValueLength *mantissaLength)

{
  byte bVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  Exception *this_00;
  ValueLength length;
  bool bVar4;
  
  bVar1 = **(byte **)this;
  if ((ulong)bVar1 - 200 < 0x10) {
    bVar4 = (bVar1 & 0xf8) == 200;
    length = ((ulong)bVar4 << 3 | 0xffffffffffffff31) + (ulong)bVar1;
    *sign = -!bVar4 | 1;
    puVar2 = valueStart(this);
    *exponent = *(int32_t *)(puVar2 + length + 1);
    puVar2 = valueStart(this);
    uVar3 = readIntegerNonEmpty<unsigned_long>(puVar2 + 1,length);
    *mantissaLength = uVar3;
    puVar2 = valueStart(this);
    return puVar2 + length + 5;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type BCD");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getBCD(int8_t& sign, int32_t& exponent,
                        ValueLength& mantissaLength) const {
    if (VELOCYPACK_UNLIKELY(!isBCD())) {
      throw Exception(Exception::InvalidValueType, "Expecting type BCD");
    }

    uint64_t type = head();
    bool positive = type >= 0xc8 && type <= 0xcf;
    uint64_t mlenlen = type - (positive ? 0xc7 : 0xcf);

    sign = positive ? 1 : -1;
    exponent = static_cast<int32_t>(
        readIntegerFixed<uint32_t, 4>(valueStart() + 1 + mlenlen));
    mantissaLength =
        readIntegerNonEmpty<ValueLength>(valueStart() + 1, mlenlen);

    return valueStart() + 1 + mlenlen + 4;
  }